

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O3

void __thiscall rengine::SignalEmitter::~SignalEmitter(SignalEmitter *this)

{
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  *pvVar1;
  pointer ppBVar2;
  
  this->_vptr_SignalEmitter = (_func_int **)&PTR__SignalEmitter_00176c68;
  Signal<>::emit(&onDestruction,this);
  pvVar1 = this->m_buckets;
  if ((pvVar1 != (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                  *)0x0) &&
     (ppBVar2 = (pvVar1->
                super__Vector_base<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                )._M_impl.super__Vector_impl_data._M_start, ppBVar2 != (pointer)0x0)) {
    operator_delete(ppBVar2);
  }
  operator_delete(pvVar1);
  return;
}

Assistant:

SignalEmitter::~SignalEmitter()
{
    onDestruction.emit(this);
    delete m_buckets;
}